

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

bool embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::TriangleMiIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  undefined8 *puVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  int iVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  Scene *pSVar16;
  float **ppfVar17;
  float *pfVar18;
  float *pfVar19;
  float *pfVar20;
  float *pfVar21;
  Geometry *pGVar22;
  RTCFilterFunctionN p_Var23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  int iVar30;
  ulong uVar31;
  long lVar32;
  RTCRayN *pRVar33;
  ulong uVar34;
  undefined4 uVar35;
  ulong unaff_RBX;
  size_t mask;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  NodeRef *pNVar39;
  ulong uVar40;
  size_t sVar41;
  uint uVar42;
  ulong uVar43;
  bool bVar44;
  bool bVar45;
  float fVar46;
  float fVar47;
  float fVar56;
  float fVar57;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  float fVar58;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar71;
  float fVar73;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  float fVar72;
  float fVar74;
  float fVar75;
  float fVar76;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  float fVar77;
  float fVar78;
  float fVar82;
  float fVar83;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  undefined1 auVar87 [16];
  float fVar92;
  float fVar93;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  undefined1 auVar109 [16];
  float fVar119;
  float fVar120;
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  undefined1 auVar121 [16];
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar151;
  float fVar152;
  float fVar153;
  undefined1 auVar147 [16];
  UVIdentity<4> mapUV;
  undefined1 local_ab8 [16];
  undefined1 (*local_aa8) [16];
  ulong local_aa0;
  ulong local_a98;
  NodeRef *local_a90;
  float local_a88;
  float fStack_a84;
  float fStack_a80;
  float fStack_a7c;
  RTCFilterFunctionNArguments args;
  undefined8 local_938;
  undefined8 uStack_930;
  undefined8 local_928;
  undefined8 uStack_920;
  float local_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  undefined1 local_908 [16];
  undefined1 local_8f8 [16];
  UVIdentity<4> *local_8e8;
  undefined1 local_8d8 [16];
  undefined1 local_8c8 [16];
  undefined1 local_8b8 [16];
  undefined1 local_8a8 [16];
  undefined1 local_898 [16];
  undefined1 local_888 [16];
  undefined1 local_878 [16];
  RTCHitN local_868 [16];
  undefined4 local_858;
  undefined4 uStack_854;
  undefined4 uStack_850;
  undefined4 uStack_84c;
  undefined1 local_848 [16];
  undefined4 local_838;
  undefined4 uStack_834;
  undefined4 uStack_830;
  undefined4 uStack_82c;
  undefined1 local_828 [16];
  undefined1 local_818 [16];
  uint local_808;
  uint uStack_804;
  uint uStack_800;
  uint uStack_7fc;
  uint local_7f8;
  uint uStack_7f4;
  uint uStack_7f0;
  uint uStack_7ec;
  uint local_7e8;
  uint uStack_7e4;
  uint uStack_7e0;
  uint uStack_7dc;
  NodeRef stack [244];
  
  stack[0] = root;
  fVar10 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar11 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar12 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar59 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar77 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar85 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar92 = fVar59 * 0.99999964;
  fVar93 = fVar77 * 0.99999964;
  fVar46 = fVar85 * 0.99999964;
  fVar59 = fVar59 * 1.0000004;
  fVar77 = fVar77 * 1.0000004;
  fVar85 = fVar85 * 1.0000004;
  uVar37 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar38 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar43 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar36 = uVar38 ^ 0x10;
  iVar13 = (tray->tnear).field_0.i[k];
  iVar30 = (tray->tfar).field_0.i[k];
  auVar48._4_4_ = iVar30;
  auVar48._0_4_ = iVar30;
  auVar48._8_4_ = iVar30;
  auVar48._12_4_ = iVar30;
  local_aa8 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  pNVar39 = stack + 1;
  do {
    local_a90 = pNVar39;
    if (local_a90 == stack) break;
    pNVar39 = local_a90 + -1;
    sVar41 = local_a90[-1].ptr;
    do {
      if ((sVar41 & 8) == 0) {
        pfVar8 = (float *)(sVar41 + 0x20 + uVar37);
        auVar49._0_4_ = (*pfVar8 - fVar10) * fVar92;
        auVar49._4_4_ = (pfVar8[1] - fVar10) * fVar92;
        auVar49._8_4_ = (pfVar8[2] - fVar10) * fVar92;
        auVar49._12_4_ = (pfVar8[3] - fVar10) * fVar92;
        pfVar8 = (float *)(sVar41 + 0x20 + uVar38);
        auVar62._0_4_ = (*pfVar8 - fVar11) * fVar93;
        auVar62._4_4_ = (pfVar8[1] - fVar11) * fVar93;
        auVar62._8_4_ = (pfVar8[2] - fVar11) * fVar93;
        auVar62._12_4_ = (pfVar8[3] - fVar11) * fVar93;
        auVar49 = maxps(auVar49,auVar62);
        pfVar8 = (float *)(sVar41 + 0x20 + uVar43);
        auVar63._0_4_ = (*pfVar8 - fVar12) * fVar46;
        auVar63._4_4_ = (pfVar8[1] - fVar12) * fVar46;
        auVar63._8_4_ = (pfVar8[2] - fVar12) * fVar46;
        auVar63._12_4_ = (pfVar8[3] - fVar12) * fVar46;
        auVar64._4_4_ = iVar13;
        auVar64._0_4_ = iVar13;
        auVar64._8_4_ = iVar13;
        auVar64._12_4_ = iVar13;
        auVar64 = maxps(auVar63,auVar64);
        auVar64 = maxps(auVar49,auVar64);
        pfVar8 = (float *)(sVar41 + 0x20 + (uVar37 ^ 0x10));
        auVar65._0_4_ = (*pfVar8 - fVar10) * fVar59;
        auVar65._4_4_ = (pfVar8[1] - fVar10) * fVar59;
        auVar65._8_4_ = (pfVar8[2] - fVar10) * fVar59;
        auVar65._12_4_ = (pfVar8[3] - fVar10) * fVar59;
        pfVar8 = (float *)(sVar41 + 0x20 + uVar36);
        auVar79._0_4_ = (*pfVar8 - fVar11) * fVar77;
        auVar79._4_4_ = (pfVar8[1] - fVar11) * fVar77;
        auVar79._8_4_ = (pfVar8[2] - fVar11) * fVar77;
        auVar79._12_4_ = (pfVar8[3] - fVar11) * fVar77;
        auVar49 = minps(auVar65,auVar79);
        pfVar8 = (float *)(sVar41 + 0x20 + (uVar43 ^ 0x10));
        auVar80._0_4_ = (*pfVar8 - fVar12) * fVar85;
        auVar80._4_4_ = (pfVar8[1] - fVar12) * fVar85;
        auVar80._8_4_ = (pfVar8[2] - fVar12) * fVar85;
        auVar80._12_4_ = (pfVar8[3] - fVar12) * fVar85;
        auVar81 = minps(auVar80,auVar48);
        auVar49 = minps(auVar49,auVar81);
        auVar81._4_4_ = -(uint)(auVar64._4_4_ <= auVar49._4_4_);
        auVar81._0_4_ = -(uint)(auVar64._0_4_ <= auVar49._0_4_);
        auVar81._8_4_ = -(uint)(auVar64._8_4_ <= auVar49._8_4_);
        auVar81._12_4_ = -(uint)(auVar64._12_4_ <= auVar49._12_4_);
        uVar35 = movmskps((int)unaff_RBX,auVar81);
        unaff_RBX = CONCAT44((int)(unaff_RBX >> 0x20),uVar35);
      }
      if ((sVar41 & 8) == 0) {
        if (unaff_RBX == 0) {
          uVar42 = 4;
        }
        else {
          uVar40 = sVar41 & 0xfffffffffffffff0;
          lVar32 = 0;
          if (unaff_RBX != 0) {
            for (; (unaff_RBX >> lVar32 & 1) == 0; lVar32 = lVar32 + 1) {
            }
          }
          uVar42 = 0;
          sVar41 = *(size_t *)(uVar40 + lVar32 * 8);
          uVar34 = unaff_RBX - 1 & unaff_RBX;
          if (uVar34 != 0) {
            pNVar39->ptr = sVar41;
            lVar32 = 0;
            if (uVar34 != 0) {
              for (; (uVar34 >> lVar32 & 1) == 0; lVar32 = lVar32 + 1) {
              }
            }
            uVar31 = uVar34 - 1;
            while( true ) {
              pNVar39 = pNVar39 + 1;
              sVar41 = *(size_t *)(uVar40 + lVar32 * 8);
              uVar31 = uVar31 & uVar34;
              if (uVar31 == 0) break;
              pNVar39->ptr = sVar41;
              lVar32 = 0;
              if (uVar31 != 0) {
                for (; (uVar31 >> lVar32 & 1) == 0; lVar32 = lVar32 + 1) {
                }
              }
              uVar34 = uVar31 - 1;
            }
          }
        }
      }
      else {
        uVar42 = 6;
      }
    } while (uVar42 == 0);
    if (uVar42 == 6) {
      uVar42 = 0;
      local_aa0 = (ulong)((uint)sVar41 & 0xf) - 8;
      bVar44 = local_aa0 != 0;
      if (bVar44) {
        uVar34 = sVar41 & 0xfffffffffffffff0;
        local_a98 = 0;
        uVar40 = uVar36;
        do {
          lVar32 = local_a98 * 0x50;
          pSVar16 = context->scene;
          ppfVar17 = (pSVar16->vertices).items;
          pfVar18 = ppfVar17[*(uint *)(uVar34 + 0x30 + lVar32)];
          pfVar8 = pfVar18 + *(uint *)(uVar34 + lVar32);
          pfVar1 = pfVar18 + *(uint *)(uVar34 + 0x10 + lVar32);
          pfVar18 = pfVar18 + *(uint *)(uVar34 + 0x20 + lVar32);
          pfVar19 = ppfVar17[*(uint *)(uVar34 + 0x34 + lVar32)];
          pfVar2 = pfVar19 + *(uint *)(uVar34 + 4 + lVar32);
          pfVar3 = pfVar19 + *(uint *)(uVar34 + 0x14 + lVar32);
          pfVar19 = pfVar19 + *(uint *)(uVar34 + 0x24 + lVar32);
          pfVar20 = ppfVar17[*(uint *)(uVar34 + 0x38 + lVar32)];
          pfVar4 = pfVar20 + *(uint *)(uVar34 + 8 + lVar32);
          pfVar5 = pfVar20 + *(uint *)(uVar34 + 0x18 + lVar32);
          pfVar20 = pfVar20 + *(uint *)(uVar34 + 0x28 + lVar32);
          pfVar21 = ppfVar17[*(uint *)(uVar34 + 0x3c + lVar32)];
          pfVar6 = pfVar21 + *(uint *)(uVar34 + 0xc + lVar32);
          pfVar7 = pfVar21 + *(uint *)(uVar34 + 0x1c + lVar32);
          pfVar21 = pfVar21 + *(uint *)(uVar34 + 0x2c + lVar32);
          puVar9 = (undefined8 *)(uVar34 + 0x30 + lVar32);
          local_928 = *puVar9;
          uStack_920 = puVar9[1];
          puVar9 = (undefined8 *)(uVar34 + 0x40 + lVar32);
          local_938 = *puVar9;
          uStack_930 = puVar9[1];
          local_8e8 = &mapUV;
          fVar131 = *(float *)(ray + k * 4);
          fVar90 = *(float *)(ray + k * 4 + 0x10);
          fVar58 = *(float *)(ray + k * 4 + 0x20);
          local_a88 = *pfVar8 - fVar131;
          fStack_a84 = *pfVar2 - fVar131;
          fStack_a80 = *pfVar4 - fVar131;
          fStack_a7c = *pfVar6 - fVar131;
          fVar132 = pfVar8[1] - fVar90;
          fVar135 = pfVar2[1] - fVar90;
          fVar137 = pfVar4[1] - fVar90;
          fVar139 = pfVar6[1] - fVar90;
          fVar145 = pfVar8[2] - fVar58;
          fVar148 = pfVar2[2] - fVar58;
          fVar150 = pfVar4[2] - fVar58;
          fVar152 = pfVar6[2] - fVar58;
          fVar60 = *pfVar1 - fVar131;
          fVar71 = *pfVar3 - fVar131;
          fVar73 = *pfVar5 - fVar131;
          fVar75 = *pfVar7 - fVar131;
          fVar78 = pfVar1[1] - fVar90;
          fVar82 = pfVar3[1] - fVar90;
          fVar83 = pfVar5[1] - fVar90;
          fVar84 = pfVar7[1] - fVar90;
          fVar106 = pfVar1[2] - fVar58;
          fVar110 = pfVar3[2] - fVar58;
          fVar113 = pfVar5[2] - fVar58;
          fVar116 = pfVar7[2] - fVar58;
          fVar128 = *pfVar18 - fVar131;
          fVar129 = *pfVar19 - fVar131;
          fVar130 = *pfVar20 - fVar131;
          fVar131 = *pfVar21 - fVar131;
          fVar86 = pfVar18[1] - fVar90;
          fVar88 = pfVar19[1] - fVar90;
          fVar89 = pfVar20[1] - fVar90;
          fVar90 = pfVar21[1] - fVar90;
          fVar47 = pfVar18[2] - fVar58;
          fVar56 = pfVar19[2] - fVar58;
          fVar57 = pfVar20[2] - fVar58;
          fVar58 = pfVar21[2] - fVar58;
          fVar107 = fVar128 - local_a88;
          fVar111 = fVar129 - fStack_a84;
          fVar114 = fVar130 - fStack_a80;
          fVar117 = fVar131 - fStack_a7c;
          fVar141 = fVar86 - fVar132;
          fVar142 = fVar88 - fVar135;
          fVar143 = fVar89 - fVar137;
          fVar144 = fVar90 - fVar139;
          fVar119 = fVar47 - fVar145;
          fVar122 = fVar56 - fVar148;
          fVar124 = fVar57 - fVar150;
          fVar126 = fVar58 - fVar152;
          fVar91 = *(float *)(ray + k * 4 + 0x50);
          fVar105 = *(float *)(ray + k * 4 + 0x60);
          fVar134 = *(float *)(ray + k * 4 + 0x40);
          local_918 = (fVar141 * (fVar47 + fVar145) - (fVar86 + fVar132) * fVar119) * fVar134 +
                      ((fVar128 + local_a88) * fVar119 - (fVar47 + fVar145) * fVar107) * fVar91 +
                      (fVar107 * (fVar86 + fVar132) - (fVar128 + local_a88) * fVar141) * fVar105;
          fStack_914 = (fVar142 * (fVar56 + fVar148) - (fVar88 + fVar135) * fVar122) * fVar134 +
                       ((fVar129 + fStack_a84) * fVar122 - (fVar56 + fVar148) * fVar111) * fVar91 +
                       (fVar111 * (fVar88 + fVar135) - (fVar129 + fStack_a84) * fVar142) * fVar105;
          fStack_910 = (fVar143 * (fVar57 + fVar150) - (fVar89 + fVar137) * fVar124) * fVar134 +
                       ((fVar130 + fStack_a80) * fVar124 - (fVar57 + fVar150) * fVar114) * fVar91 +
                       (fVar114 * (fVar89 + fVar137) - (fVar130 + fStack_a80) * fVar143) * fVar105;
          fStack_90c = (fVar144 * (fVar58 + fVar152) - (fVar90 + fVar139) * fVar126) * fVar134 +
                       ((fVar131 + fStack_a7c) * fVar126 - (fVar58 + fVar152) * fVar117) * fVar91 +
                       (fVar117 * (fVar90 + fVar139) - (fVar131 + fStack_a7c) * fVar144) * fVar105;
          fVar108 = local_a88 - fVar60;
          fVar112 = fStack_a84 - fVar71;
          fVar115 = fStack_a80 - fVar73;
          fVar118 = fStack_a7c - fVar75;
          fVar120 = fVar132 - fVar78;
          fVar123 = fVar135 - fVar82;
          fVar125 = fVar137 - fVar83;
          fVar127 = fVar139 - fVar84;
          fVar61 = fVar145 - fVar106;
          fVar72 = fVar148 - fVar110;
          fVar74 = fVar150 - fVar113;
          fVar76 = fVar152 - fVar116;
          fVar97 = (fVar120 * (fVar145 + fVar106) - (fVar132 + fVar78) * fVar61) * fVar134 +
                   ((local_a88 + fVar60) * fVar61 - (fVar145 + fVar106) * fVar108) * fVar91 +
                   (fVar108 * (fVar132 + fVar78) - (local_a88 + fVar60) * fVar120) * fVar105;
          fVar98 = (fVar123 * (fVar148 + fVar110) - (fVar135 + fVar82) * fVar72) * fVar134 +
                   ((fStack_a84 + fVar71) * fVar72 - (fVar148 + fVar110) * fVar112) * fVar91 +
                   (fVar112 * (fVar135 + fVar82) - (fStack_a84 + fVar71) * fVar123) * fVar105;
          fVar99 = (fVar125 * (fVar150 + fVar113) - (fVar137 + fVar83) * fVar74) * fVar134 +
                   ((fStack_a80 + fVar73) * fVar74 - (fVar150 + fVar113) * fVar115) * fVar91 +
                   (fVar115 * (fVar137 + fVar83) - (fStack_a80 + fVar73) * fVar125) * fVar105;
          fVar100 = (fVar127 * (fVar152 + fVar116) - (fVar139 + fVar84) * fVar76) * fVar134 +
                    ((fStack_a7c + fVar75) * fVar76 - (fVar152 + fVar116) * fVar118) * fVar91 +
                    (fVar118 * (fVar139 + fVar84) - (fStack_a7c + fVar75) * fVar127) * fVar105;
          fVar146 = fVar60 - fVar128;
          fVar149 = fVar71 - fVar129;
          fVar151 = fVar73 - fVar130;
          fVar153 = fVar75 - fVar131;
          fVar133 = fVar78 - fVar86;
          fVar136 = fVar82 - fVar88;
          fVar138 = fVar83 - fVar89;
          fVar140 = fVar84 - fVar90;
          fVar101 = fVar106 - fVar47;
          fVar102 = fVar110 - fVar56;
          fVar103 = fVar113 - fVar57;
          fVar104 = fVar116 - fVar58;
          auVar66._0_4_ =
               (fVar133 * (fVar47 + fVar106) - (fVar86 + fVar78) * fVar101) * fVar134 +
               ((fVar128 + fVar60) * fVar101 - (fVar47 + fVar106) * fVar146) * fVar91 +
               (fVar146 * (fVar86 + fVar78) - (fVar128 + fVar60) * fVar133) * fVar105;
          auVar66._4_4_ =
               (fVar136 * (fVar56 + fVar110) - (fVar88 + fVar82) * fVar102) * fVar134 +
               ((fVar129 + fVar71) * fVar102 - (fVar56 + fVar110) * fVar149) * fVar91 +
               (fVar149 * (fVar88 + fVar82) - (fVar129 + fVar71) * fVar136) * fVar105;
          auVar66._8_4_ =
               (fVar138 * (fVar57 + fVar113) - (fVar89 + fVar83) * fVar103) * fVar134 +
               ((fVar130 + fVar73) * fVar103 - (fVar57 + fVar113) * fVar151) * fVar91 +
               (fVar151 * (fVar89 + fVar83) - (fVar130 + fVar73) * fVar138) * fVar105;
          auVar66._12_4_ =
               (fVar140 * (fVar58 + fVar116) - (fVar90 + fVar84) * fVar104) * fVar134 +
               ((fVar131 + fVar75) * fVar104 - (fVar58 + fVar116) * fVar153) * fVar91 +
               (fVar153 * (fVar90 + fVar84) - (fVar131 + fVar75) * fVar140) * fVar105;
          fVar56 = local_918 + fVar97 + auVar66._0_4_;
          fVar57 = fStack_914 + fVar98 + auVar66._4_4_;
          fVar60 = fStack_910 + fVar99 + auVar66._8_4_;
          fVar71 = fStack_90c + fVar100 + auVar66._12_4_;
          auVar50._8_4_ = fStack_910;
          auVar50._0_8_ = CONCAT44(fStack_914,local_918);
          auVar50._12_4_ = fStack_90c;
          auVar24._4_4_ = fVar98;
          auVar24._0_4_ = fVar97;
          auVar24._8_4_ = fVar99;
          auVar24._12_4_ = fVar100;
          auVar64 = minps(auVar50,auVar24);
          auVar64 = minps(auVar64,auVar66);
          auVar94._8_4_ = fStack_910;
          auVar94._0_8_ = CONCAT44(fStack_914,local_918);
          auVar94._12_4_ = fStack_90c;
          auVar25._4_4_ = fVar98;
          auVar25._0_4_ = fVar97;
          auVar25._8_4_ = fVar99;
          auVar25._12_4_ = fVar100;
          auVar49 = maxps(auVar94,auVar25);
          auVar49 = maxps(auVar49,auVar66);
          fVar131 = ABS(fVar56) * 1.1920929e-07;
          fVar90 = ABS(fVar57) * 1.1920929e-07;
          fVar58 = ABS(fVar60) * 1.1920929e-07;
          fVar47 = ABS(fVar71) * 1.1920929e-07;
          auVar95._4_4_ = -(uint)(auVar49._4_4_ <= fVar90);
          auVar95._0_4_ = -(uint)(auVar49._0_4_ <= fVar131);
          auVar95._8_4_ = -(uint)(auVar49._8_4_ <= fVar58);
          auVar95._12_4_ = -(uint)(auVar49._12_4_ <= fVar47);
          auVar51._4_4_ = -(uint)(-fVar90 <= auVar64._4_4_);
          auVar51._0_4_ = -(uint)(-fVar131 <= auVar64._0_4_);
          auVar51._8_4_ = -(uint)(-fVar58 <= auVar64._8_4_);
          auVar51._12_4_ = -(uint)(-fVar47 <= auVar64._12_4_);
          auVar95 = auVar95 | auVar51;
          iVar30 = movmskps((int)&mapUV,auVar95);
          if (iVar30 != 0) {
            auVar121._0_4_ = fVar120 * fVar101 - fVar133 * fVar61;
            auVar121._4_4_ = fVar123 * fVar102 - fVar136 * fVar72;
            auVar121._8_4_ = fVar125 * fVar103 - fVar138 * fVar74;
            auVar121._12_4_ = fVar127 * fVar104 - fVar140 * fVar76;
            auVar52._4_4_ = -(uint)(ABS(fVar123 * fVar122) < ABS(fVar136 * fVar72));
            auVar52._0_4_ = -(uint)(ABS(fVar120 * fVar119) < ABS(fVar133 * fVar61));
            auVar52._8_4_ = -(uint)(ABS(fVar125 * fVar124) < ABS(fVar138 * fVar74));
            auVar52._12_4_ = -(uint)(ABS(fVar127 * fVar126) < ABS(fVar140 * fVar76));
            auVar28._4_4_ = fVar142 * fVar72 - fVar123 * fVar122;
            auVar28._0_4_ = fVar141 * fVar61 - fVar120 * fVar119;
            auVar28._8_4_ = fVar143 * fVar74 - fVar125 * fVar124;
            auVar28._12_4_ = fVar144 * fVar76 - fVar127 * fVar126;
            local_898 = blendvps(auVar121,auVar28,auVar52);
            auVar147._0_4_ = fVar146 * fVar61 - fVar108 * fVar101;
            auVar147._4_4_ = fVar149 * fVar72 - fVar112 * fVar102;
            auVar147._8_4_ = fVar151 * fVar74 - fVar115 * fVar103;
            auVar147._12_4_ = fVar153 * fVar76 - fVar118 * fVar104;
            auVar53._4_4_ = -(uint)(ABS(fVar111 * fVar72) < ABS(fVar112 * fVar102));
            auVar53._0_4_ = -(uint)(ABS(fVar107 * fVar61) < ABS(fVar108 * fVar101));
            auVar53._8_4_ = -(uint)(ABS(fVar114 * fVar74) < ABS(fVar115 * fVar103));
            auVar53._12_4_ = -(uint)(ABS(fVar117 * fVar76) < ABS(fVar118 * fVar104));
            auVar26._4_4_ = fVar122 * fVar112 - fVar111 * fVar72;
            auVar26._0_4_ = fVar119 * fVar108 - fVar107 * fVar61;
            auVar26._8_4_ = fVar124 * fVar115 - fVar114 * fVar74;
            auVar26._12_4_ = fVar126 * fVar118 - fVar117 * fVar76;
            local_888 = blendvps(auVar147,auVar26,auVar53);
            auVar109._0_4_ = fVar108 * fVar133 - fVar146 * fVar120;
            auVar109._4_4_ = fVar112 * fVar136 - fVar149 * fVar123;
            auVar109._8_4_ = fVar115 * fVar138 - fVar151 * fVar125;
            auVar109._12_4_ = fVar118 * fVar140 - fVar153 * fVar127;
            auVar54._4_4_ = -(uint)(ABS(fVar112 * fVar142) < ABS(fVar149 * fVar123));
            auVar54._0_4_ = -(uint)(ABS(fVar108 * fVar141) < ABS(fVar146 * fVar120));
            auVar54._8_4_ = -(uint)(ABS(fVar115 * fVar143) < ABS(fVar151 * fVar125));
            auVar54._12_4_ = -(uint)(ABS(fVar118 * fVar144) < ABS(fVar153 * fVar127));
            auVar29._4_4_ = fVar111 * fVar123 - fVar112 * fVar142;
            auVar29._0_4_ = fVar107 * fVar120 - fVar108 * fVar141;
            auVar29._8_4_ = fVar114 * fVar125 - fVar115 * fVar143;
            auVar29._12_4_ = fVar117 * fVar127 - fVar118 * fVar144;
            local_878 = blendvps(auVar109,auVar29,auVar54);
            fVar47 = fVar134 * local_898._0_4_ +
                     fVar91 * local_888._0_4_ + fVar105 * local_878._0_4_;
            fVar61 = fVar134 * local_898._4_4_ +
                     fVar91 * local_888._4_4_ + fVar105 * local_878._4_4_;
            fVar72 = fVar134 * local_898._8_4_ +
                     fVar91 * local_888._8_4_ + fVar105 * local_878._8_4_;
            fVar105 = fVar134 * local_898._12_4_ +
                      fVar91 * local_888._12_4_ + fVar105 * local_878._12_4_;
            fVar47 = fVar47 + fVar47;
            fVar61 = fVar61 + fVar61;
            fVar72 = fVar72 + fVar72;
            fVar105 = fVar105 + fVar105;
            auVar67._0_4_ = fVar145 * local_878._0_4_;
            auVar67._4_4_ = fVar148 * local_878._4_4_;
            auVar67._8_4_ = fVar150 * local_878._8_4_;
            auVar67._12_4_ = fVar152 * local_878._12_4_;
            fVar134 = local_a88 * local_898._0_4_ + fVar132 * local_888._0_4_ + auVar67._0_4_;
            fVar73 = fStack_a84 * local_898._4_4_ + fVar135 * local_888._4_4_ + auVar67._4_4_;
            fVar74 = fStack_a80 * local_898._8_4_ + fVar137 * local_888._8_4_ + auVar67._8_4_;
            fVar75 = fStack_a7c * local_898._12_4_ + fVar139 * local_888._12_4_ + auVar67._12_4_;
            auVar27._4_4_ = fVar61;
            auVar27._0_4_ = fVar47;
            auVar27._8_4_ = fVar72;
            auVar27._12_4_ = fVar105;
            auVar64 = rcpps(auVar67,auVar27);
            fVar131 = auVar64._0_4_;
            fVar90 = auVar64._4_4_;
            fVar58 = auVar64._8_4_;
            fVar91 = auVar64._12_4_;
            local_8a8._0_4_ =
                 (((float)DAT_01feca10 - fVar47 * fVar131) * fVar131 + fVar131) *
                 (fVar134 + fVar134);
            local_8a8._4_4_ =
                 ((DAT_01feca10._4_4_ - fVar61 * fVar90) * fVar90 + fVar90) * (fVar73 + fVar73);
            local_8a8._8_4_ =
                 ((DAT_01feca10._8_4_ - fVar72 * fVar58) * fVar58 + fVar58) * (fVar74 + fVar74);
            local_8a8._12_4_ =
                 ((DAT_01feca10._12_4_ - fVar105 * fVar91) * fVar91 + fVar91) * (fVar75 + fVar75);
            fVar131 = *(float *)(ray + k * 4 + 0x80);
            fVar90 = *(float *)(ray + k * 4 + 0x30);
            auVar68._0_4_ =
                 -(uint)(local_8a8._0_4_ <= fVar131 && fVar90 <= local_8a8._0_4_) & auVar95._0_4_;
            auVar68._4_4_ =
                 -(uint)(local_8a8._4_4_ <= fVar131 && fVar90 <= local_8a8._4_4_) & auVar95._4_4_;
            auVar68._8_4_ =
                 -(uint)(local_8a8._8_4_ <= fVar131 && fVar90 <= local_8a8._8_4_) & auVar95._8_4_;
            auVar68._12_4_ =
                 -(uint)(local_8a8._12_4_ <= fVar131 && fVar90 <= local_8a8._12_4_) & auVar95._12_4_
            ;
            iVar30 = movmskps(iVar30,auVar68);
            if (iVar30 != 0) {
              local_8d8._0_4_ = auVar68._0_4_ & -(uint)(fVar47 != 0.0);
              local_8d8._4_4_ = auVar68._4_4_ & -(uint)(fVar61 != 0.0);
              local_8d8._8_4_ = auVar68._8_4_ & -(uint)(fVar72 != 0.0);
              local_8d8._12_4_ = auVar68._12_4_ & -(uint)(fVar105 != 0.0);
              iVar30 = movmskps((int)uVar40,local_8d8);
              uVar40 = CONCAT44((int)(uVar40 >> 0x20),iVar30);
              if (iVar30 != 0) {
                local_908._4_4_ = fVar98;
                local_908._0_4_ = fVar97;
                local_908._8_4_ = fVar99;
                local_908._12_4_ = fVar100;
                local_8f8._4_4_ = fVar57;
                local_8f8._0_4_ = fVar56;
                local_8f8._8_4_ = fVar60;
                local_8f8._12_4_ = fVar71;
                local_8e8 = &mapUV;
                auVar64 = rcpps(local_8a8,local_8f8);
                fVar131 = auVar64._0_4_;
                fVar90 = auVar64._4_4_;
                fVar58 = auVar64._8_4_;
                fVar91 = auVar64._12_4_;
                fVar131 = (float)(-(uint)(1e-18 <= ABS(fVar56)) &
                                 (uint)(((float)DAT_01feca10 - fVar56 * fVar131) * fVar131 + fVar131
                                       ));
                fVar90 = (float)(-(uint)(1e-18 <= ABS(fVar57)) &
                                (uint)((DAT_01feca10._4_4_ - fVar57 * fVar90) * fVar90 + fVar90));
                fVar58 = (float)(-(uint)(1e-18 <= ABS(fVar60)) &
                                (uint)((DAT_01feca10._8_4_ - fVar60 * fVar58) * fVar58 + fVar58));
                fVar91 = (float)(-(uint)(1e-18 <= ABS(fVar71)) &
                                (uint)((DAT_01feca10._12_4_ - fVar71 * fVar91) * fVar91 + fVar91));
                auVar96._0_4_ = local_918 * fVar131;
                auVar96._4_4_ = fStack_914 * fVar90;
                auVar96._8_4_ = fStack_910 * fVar58;
                auVar96._12_4_ = fStack_90c * fVar91;
                local_8c8 = minps(auVar96,_DAT_01feca10);
                auVar87._0_4_ = fVar131 * fVar97;
                auVar87._4_4_ = fVar90 * fVar98;
                auVar87._8_4_ = fVar58 * fVar99;
                auVar87._12_4_ = fVar91 * fVar100;
                local_8b8 = minps(auVar87,_DAT_01feca10);
                do {
                  uVar31 = 0;
                  if (uVar40 != 0) {
                    for (; (uVar40 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
                    }
                  }
                  local_808 = *(uint *)((long)&local_928 + uVar31 * 4);
                  pGVar22 = (pSVar16->geometries).items[local_808].ptr;
                  if ((pGVar22->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                    uVar40 = uVar40 ^ 1L << (uVar31 & 0x3f);
                    bVar45 = true;
                  }
                  else if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                          (pGVar22->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                    bVar45 = false;
                  }
                  else {
                    uVar35 = *(undefined4 *)(ray + k * 4 + 0x80);
                    local_838 = *(undefined4 *)(local_8c8 + uVar31 * 4);
                    uVar14 = *(undefined4 *)(local_8b8 + uVar31 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_8a8 + uVar31 * 4);
                    args.context = context->user;
                    uVar15 = *(undefined4 *)((long)&local_938 + uVar31 * 4);
                    local_818._4_4_ = uVar15;
                    local_818._0_4_ = uVar15;
                    local_818._8_4_ = uVar15;
                    local_818._12_4_ = uVar15;
                    local_828._4_4_ = uVar14;
                    local_828._0_4_ = uVar14;
                    local_828._8_4_ = uVar14;
                    local_828._12_4_ = uVar14;
                    uVar14 = *(undefined4 *)(local_898 + uVar31 * 4);
                    local_858 = *(undefined4 *)(local_888 + uVar31 * 4);
                    uVar15 = *(undefined4 *)(local_878 + uVar31 * 4);
                    local_848._4_4_ = uVar15;
                    local_848._0_4_ = uVar15;
                    local_848._8_4_ = uVar15;
                    local_848._12_4_ = uVar15;
                    local_868[0] = (RTCHitN)(char)uVar14;
                    local_868[1] = (RTCHitN)(char)((uint)uVar14 >> 8);
                    local_868[2] = (RTCHitN)(char)((uint)uVar14 >> 0x10);
                    local_868[3] = (RTCHitN)(char)((uint)uVar14 >> 0x18);
                    local_868[4] = (RTCHitN)(char)uVar14;
                    local_868[5] = (RTCHitN)(char)((uint)uVar14 >> 8);
                    local_868[6] = (RTCHitN)(char)((uint)uVar14 >> 0x10);
                    local_868[7] = (RTCHitN)(char)((uint)uVar14 >> 0x18);
                    local_868[8] = (RTCHitN)(char)uVar14;
                    local_868[9] = (RTCHitN)(char)((uint)uVar14 >> 8);
                    local_868[10] = (RTCHitN)(char)((uint)uVar14 >> 0x10);
                    local_868[0xb] = (RTCHitN)(char)((uint)uVar14 >> 0x18);
                    local_868[0xc] = (RTCHitN)(char)uVar14;
                    local_868[0xd] = (RTCHitN)(char)((uint)uVar14 >> 8);
                    local_868[0xe] = (RTCHitN)(char)((uint)uVar14 >> 0x10);
                    local_868[0xf] = (RTCHitN)(char)((uint)uVar14 >> 0x18);
                    uStack_854 = local_858;
                    uStack_850 = local_858;
                    uStack_84c = local_858;
                    uStack_834 = local_838;
                    uStack_830 = local_838;
                    uStack_82c = local_838;
                    uStack_804 = local_808;
                    uStack_800 = local_808;
                    uStack_7fc = local_808;
                    local_7f8 = (args.context)->instID[0];
                    uStack_7f4 = local_7f8;
                    uStack_7f0 = local_7f8;
                    uStack_7ec = local_7f8;
                    local_7e8 = (args.context)->instPrimID[0];
                    uStack_7e4 = local_7e8;
                    uStack_7e0 = local_7e8;
                    uStack_7dc = local_7e8;
                    local_ab8 = *local_aa8;
                    args.valid = (int *)local_ab8;
                    args.geometryUserPtr = pGVar22->userPtr;
                    args.hit = local_868;
                    args.N = 4;
                    pRVar33 = (RTCRayN *)pGVar22->occlusionFilterN;
                    args.ray = (RTCRayN *)ray;
                    if (pRVar33 != (RTCRayN *)0x0) {
                      pRVar33 = (RTCRayN *)(*(code *)pRVar33)(&args);
                    }
                    if (local_ab8 == (undefined1  [16])0x0) {
                      auVar69._8_4_ = 0xffffffff;
                      auVar69._0_8_ = 0xffffffffffffffff;
                      auVar69._12_4_ = 0xffffffff;
                      auVar69 = auVar69 ^ _DAT_01febe20;
                    }
                    else {
                      p_Var23 = context->args->filter;
                      if ((p_Var23 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar22->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var23)(&args);
                      }
                      auVar55._0_4_ = -(uint)(local_ab8._0_4_ == 0);
                      auVar55._4_4_ = -(uint)(local_ab8._4_4_ == 0);
                      auVar55._8_4_ = -(uint)(local_ab8._8_4_ == 0);
                      auVar55._12_4_ = -(uint)(local_ab8._12_4_ == 0);
                      auVar69 = auVar55 ^ _DAT_01febe20;
                      auVar64 = blendvps(_DAT_01feba00,*(undefined1 (*) [16])(args.ray + 0x80),
                                         auVar55);
                      *(undefined1 (*) [16])(args.ray + 0x80) = auVar64;
                      pRVar33 = args.ray;
                    }
                    auVar70._0_4_ = auVar69._0_4_ << 0x1f;
                    auVar70._4_4_ = auVar69._4_4_ << 0x1f;
                    auVar70._8_4_ = auVar69._8_4_ << 0x1f;
                    auVar70._12_4_ = auVar69._12_4_ << 0x1f;
                    iVar30 = movmskps((int)pRVar33,auVar70);
                    bVar45 = iVar30 == 0;
                    if (bVar45) {
                      *(undefined4 *)(ray + k * 4 + 0x80) = uVar35;
                      uVar40 = uVar40 ^ 1L << (uVar31 & 0x3f);
                    }
                  }
                  if (!bVar45) {
                    if (bVar44) {
                      *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
                      uVar42 = 1;
                    }
                    goto LAB_00272ee9;
                  }
                } while (uVar40 != 0);
                uVar40 = 0;
              }
            }
          }
          local_a98 = local_a98 + 1;
          bVar44 = local_a98 < local_aa0;
        } while (local_a98 != local_aa0);
      }
    }
LAB_00272ee9:
  } while ((uVar42 & 3) == 0);
  return local_a90 != stack;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }